

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.h
# Opt level: O2

TestAllTypes_NestedMessage * __thiscall
edition_unittest::TestAllTypes::_internal_mutable_optional_nested_message(TestAllTypes *this)

{
  TestAllTypes_NestedMessage *pTVar1;
  Arena *arena;
  
  pTVar1 = (this->field_0)._impl_.optional_nested_message_;
  if (pTVar1 != (TestAllTypes_NestedMessage *)0x0) {
    return pTVar1;
  }
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  pTVar1 = (TestAllTypes_NestedMessage *)
           google::protobuf::Arena::DefaultConstruct<edition_unittest::TestAllTypes_NestedMessage>
                     (arena);
  (this->field_0)._impl_.optional_nested_message_ = pTVar1;
  return pTVar1;
}

Assistant:

TestAllTypes::_internal_mutable_optional_nested_message() {
  ::google::protobuf::internal::TSanWrite(&_impl_);
  if (_impl_.optional_nested_message_ == nullptr) {
    auto* p = ::google::protobuf::Message::DefaultConstruct<::edition_unittest::TestAllTypes_NestedMessage>(GetArena());
    _impl_.optional_nested_message_ = reinterpret_cast<::edition_unittest::TestAllTypes_NestedMessage*>(p);
  }
  return _impl_.optional_nested_message_;
}